

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_COMPONENT_INDEX __thiscall
ON_MeshTopology::TopVertexComponentIndex(ON_MeshTopology *this,ON_COMPONENT_INDEX ci)

{
  ON_COMPONENT_INDEX OVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ON_MeshTopology *this_local;
  ON_COMPONENT_INDEX ci_local;
  
  this_local._0_4_ = ci.m_type;
  if ((TYPE)this_local == mesh_vertex) {
    this_local._4_4_ = ci.m_index;
    OVar1 = ci;
    if (((-1 < (long)ci) && (OVar1 = ci, this->m_mesh != (ON_Mesh *)0x0)) &&
       (iVar3 = ON_Mesh::VertexCount(this->m_mesh), OVar1 = ci, this_local._4_4_ < iVar3)) {
      iVar3 = ON_Mesh::VertexCount(this->m_mesh);
      iVar2 = ON_SimpleArray<int>::Count(&this->m_topv_map);
      OVar1 = ci;
      if (iVar3 == iVar2) {
        piVar4 = ON_SimpleArray<int>::operator[](&this->m_topv_map,this_local._4_4_);
        this_local = (ON_MeshTopology *)CONCAT44(*piVar4,0xc);
        OVar1 = (ON_COMPONENT_INDEX)this_local;
      }
    }
  }
  else {
    OVar1 = ci;
    if ((TYPE)this_local != meshtop_vertex) {
      return ON_COMPONENT_INDEX::UnsetComponentIndex;
    }
  }
  this_local = (ON_MeshTopology *)OVar1;
  if ((-1 < (long)this_local) &&
     (iVar3 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv), this_local._4_4_ < iVar3)
     ) {
    return (ON_COMPONENT_INDEX)this_local;
  }
  return ON_COMPONENT_INDEX::UnsetComponentIndex;
}

Assistant:

const ON_COMPONENT_INDEX ON_MeshTopology::TopVertexComponentIndex(
  ON_COMPONENT_INDEX ci
) const
{
  switch (ci.m_type)
  {
  case ON_COMPONENT_INDEX::TYPE::mesh_vertex:
    if (ci.m_index >= 0
      && nullptr != m_mesh 
      && ci.m_index < m_mesh->VertexCount() 
      && m_mesh->VertexCount() == m_topv_map.Count() 
      )
    {
      ci.m_type = ON_COMPONENT_INDEX::TYPE::meshtop_vertex;
      ci.m_index = m_topv_map[ci.m_index];
    }
    // no break here
  case ON_COMPONENT_INDEX::TYPE::meshtop_vertex:
    if (ci.m_index >= 0 && ci.m_index < m_topv.Count())
    {
      return ci;
    }
    break;
          
  default:
    break;
  }

  return ON_COMPONENT_INDEX::UnsetComponentIndex;
}